

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPScheduleClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPScheduleClause *this)

{
  OpenMPScheduleClauseModifier OVar1;
  OpenMPScheduleClauseKind OVar2;
  pointer pcVar3;
  int iVar4;
  string clause_string;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"schedule ","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"(","");
  OVar1 = this->modifier2;
  OVar2 = this->schedulekind;
  if (this->modifier1 < OMPC_SCHEDULE_MODIFIER_user) {
    std::__cxx11::string::append((char *)&local_70);
  }
  if (OVar1 < OMPC_SCHEDULE_MODIFIER_user) {
    std::__cxx11::string::append((char *)&local_70);
  }
  if (1 < local_68) {
    std::__cxx11::string::append((char *)&local_70);
  }
  if (OVar2 < OMPC_SCHEDULE_KIND_user) {
    std::__cxx11::string::append((char *)&local_70);
  }
  pcVar3 = (this->chunk_size)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + (this->chunk_size)._M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (iVar4 != 0) {
    std::__cxx11::string::append((char *)&local_70);
    pcVar3 = (this->chunk_size)._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar3,pcVar3 + (this->chunk_size)._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_70);
  if (3 < local_68) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPScheduleClause::toString() {

    std::string result = "schedule ";
    std::string clause_string = "(";
    OpenMPScheduleClauseModifier modifier1 = this->getModifier1();
    OpenMPScheduleClauseModifier modifier2 = this->getModifier2();
    OpenMPScheduleClauseKind kind = this->getKind();
    switch (modifier1) {
        case OMPC_SCHEDULE_MODIFIER_monotonic:
            clause_string += "monotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_nonmonotonic:
            clause_string += "nonmonotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_simd:
            clause_string += "simd";
            break;
        default:
            ;
    }
    switch (modifier2) {
        case OMPC_SCHEDULE_MODIFIER_monotonic:
            clause_string += ",monotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_nonmonotonic:
            clause_string += ",nonmonotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_simd:
            clause_string += ",simd";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1){
        clause_string += ":"; 
    }
    switch (kind) {
        case OMPC_SCHEDULE_KIND_static:
            clause_string += "static";
            break;
        case OMPC_SCHEDULE_KIND_dynamic:
            clause_string += "dynamic";
            break;
        case OMPC_SCHEDULE_KIND_guided:
            clause_string += "guided";
            break;
        case OMPC_SCHEDULE_KIND_auto:
            clause_string += "auto";
            break;
        case OMPC_SCHEDULE_KIND_runtime:
            clause_string += "runtime";
            break;
        default:
            ;
    }
    if (this->getChunkSize() != ""){
        clause_string += ", ";
        clause_string += this->getChunkSize();
    }
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}